

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void lzham::lzham_free(lzham_malloc_context context,void *p)

{
  bool bVar1;
  lzham_malloc_context in_RSI;
  malloc_context *in_RDI;
  malloc_context *pContext;
  uint in_stack_000001e4;
  char *in_stack_000001e8;
  char *in_stack_000001f0;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (lzham_malloc_context)0x0) {
    if (in_RDI == (malloc_context *)0x0) {
      lzham_assert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4);
    }
    if (((ulong)in_RSI & 0xf) == 0) {
      if (in_RDI->m_sig != 0x5749abcd) {
        lzham_assert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4);
      }
      bVar1 = malloc_context::ptr_is_in_arena(in_RDI,in_RSI);
      if (!bVar1) {
        (*(code *)g_pRealloc)(in_RSI,0,0,1,g_pUser_data);
      }
    }
    else {
      lzham_mem_error(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

void lzham_free(lzham_malloc_context context, void* p)
   {
      if (!p)
         return;
      
      LZHAM_VERIFY(context);

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_free: bad ptr");
         return;
      }
      
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

#if LZHAM_MEM_STATS
      size_t cur_size = lzham_msize(context, p);
      pContext->update_total_allocated(-1, -static_cast<int64>(cur_size));
#endif
      
      if (!pContext->ptr_is_in_arena(p))
      {
         (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
      }
   }